

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O1

void __thiscall
merlin::cte::joint_marginal
          (cte *this,variable_set *scope,vector<int,_std::allocator<int>_> *evidence)

{
  edge *peVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  size_t sVar6;
  pointer pdVar7;
  long lVar8;
  pointer pnVar9;
  cte *this_00;
  long lVar10;
  pointer ppeVar11;
  ulong uVar12;
  factor *this_01;
  ulong uVar13;
  double dVar14;
  index_config cv1;
  variable_set v_rem;
  config_index cv2;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  config;
  factor local_138;
  variable_set local_d8;
  config_index local_98;
  
  pnVar9 = (this->m_clusters).
           super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_clusters).
      super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
      super__Vector_impl_data._M_finish == pnVar9) {
    uVar12 = 0;
    bVar3 = false;
  }
  else {
    lVar10 = 8;
    uVar12 = 0;
    uVar13 = 0;
    do {
      variable_set::operator&
                ((variable_set *)&local_138,(variable_set *)((long)&pnVar9->id + lVar10),scope);
      bVar2 = variable_set::operator==((variable_set *)&local_138,scope);
      variable_set::~variable_set((variable_set *)&local_138);
      if (bVar2) {
        uVar12 = uVar13;
      }
      bVar3 = false;
      if (bVar2) {
        bVar3 = true;
        break;
      }
      uVar13 = uVar13 + 1;
      pnVar9 = (this->m_clusters).
               super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x158;
    } while (uVar13 < (ulong)(((long)(this->m_clusters).
                                     super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar9 >> 3)
                             * -0x7d05f417d05f417d));
  }
  if (bVar3) {
    factor::factor(&local_138,scope,0.0);
    factor::operator=(&this->m_marginal,&local_138);
    factor::~factor(&local_138);
    pnVar9 = (this->m_clusters).
             super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl
             .super__Vector_impl_data._M_start;
    factor::condition(&local_138,&pnVar9[uVar12].theta,evidence);
    this_01 = &pnVar9[uVar12].belief;
    factor::operator=(this_01,&local_138);
    pnVar9 = pnVar9 + uVar12;
    factor::~factor(&local_138);
    for (ppeVar11 = (pnVar9->edges).
                    super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppeVar11 !=
        *(pointer *)
         ((long)&(pnVar9->edges).
                 super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                 ._M_impl + 8); ppeVar11 = ppeVar11 + 1) {
      peVar1 = *ppeVar11;
      if (peVar1->second->id == pnVar9->id) {
        factor::binaryOpIP<merlin::factor::binOpTimes>(this_01,&peVar1->fwd);
      }
      if (peVar1->first->id == pnVar9->id) {
        factor::binaryOpIP<merlin::factor::binOpTimes>(this_01,&peVar1->bwd);
      }
    }
    local_d8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.m_d = (vsize *)0x0;
    if (*(pointer *)
         ((long)&(pnVar9->clique).m_v.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) !=
        *(pointer *)
         &(pnVar9->clique).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl) {
      lVar10 = 0;
      do {
        local_138._vptr_factor =
             *(_func_int ***)
              (*(long *)&(pnVar9->clique).m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
              lVar10 * 8);
        local_138.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(pnVar9->clique).m_d[lVar10];
        bVar3 = variable_set::contains(scope,(variable *)&local_138);
        if ((!bVar3) &&
           ((evidence->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start
            [*(long *)(*(long *)&(pnVar9->clique).m_v.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl + lVar10 * 8)] < 0)) {
          local_138._vptr_factor =
               *(_func_int ***)
                (*(long *)&(pnVar9->clique).m_v.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                + lVar10 * 8);
          local_138.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)(pnVar9->clique).m_d[lVar10];
          variable_set::operator|=(&local_d8,(variable *)&local_138);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != (long)*(pointer *)
                                ((long)&(pnVar9->clique).m_v.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                + 8) -
                         *(long *)&(pnVar9->clique).m_v.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl >> 3);
    }
    factor::sum(&local_138,this_01,&local_d8);
    factor::operator=(this_01,&local_138);
    factor::~factor(&local_138);
    if (this->m_debug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[DEBUG] Joint marginal scope: ",0x1e);
      poVar4 = operator<<((ostream *)&std::cout,&(this->m_marginal).v_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[DEBUG] Actual belief scope:  ",0x1e);
      poVar4 = operator<<((ostream *)&std::cout,this_01);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    index_config::index_config((index_config *)&local_138,&(this->m_marginal).v_,true);
    config_index::config_index(&local_98,&(pnVar9->belief).v_,true);
    if ((this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar12 = 0;
      do {
        this_00 = (cte *)&stack0xffffffffffffffa0;
        index_config::convert
                  ((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    *)&stack0xffffffffffffffa0,(index_config *)&local_138,uVar12);
        bVar3 = is_compatible(this_00,(map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                       *)&stack0xffffffffffffffa0,evidence);
        if (bVar3) {
          sVar5 = config_index::convert
                            (&local_98,
                             (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)&stack0xffffffffffffffa0);
          lVar10 = *(long *)&(pnVar9->belief).t_.super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data;
          sVar6 = sVar5;
          if (((ulong)((long)*(pointer *)
                              ((long)&(pnVar9->belief).t_.
                                      super__Vector_base<double,_std::allocator<double>_> + 8) -
                       lVar10 >> 3) <= sVar5) ||
             (pdVar7 = (this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start, sVar6 = uVar12,
             (ulong)((long)(this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar7 >> 3) <= uVar12
             )) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       sVar6);
            goto LAB_0013ab94;
          }
          dVar14 = *(double *)(lVar10 + sVar5 * 8);
        }
        else {
          pdVar7 = (this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          dVar14 = 0.0;
          if ((ulong)((long)(this->m_marginal).t_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar7 >> 3) <= uVar12) {
LAB_0013ab94:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
            goto LAB_0013aba5;
          }
        }
        pdVar7[uVar12] = dVar14;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     *)&stack0xffffffffffffffa0);
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)(this->m_marginal).t_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)(this->m_marginal).t_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 3));
    }
    dVar14 = exp(this->m_logz);
    pdVar7 = (this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)(this->m_marginal).t_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)pdVar7;
    if (lVar10 != 0) {
      lVar10 = lVar10 >> 3;
      lVar8 = 0;
      do {
        pdVar7[lVar8] = (double)((ulong)(pdVar7[lVar8] / dVar14) & -(ulong)(dVar14 != 0.0));
        lVar8 = lVar8 + 1;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar8);
    }
    if (this->m_debug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[DEBUG] Joint marginal: ",0x18);
      poVar4 = operator<<((ostream *)&std::cout,&this->m_marginal);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    if (local_98.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.m_vars.
                      super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98.m_dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.m_dims.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.v_.m_dlocal.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.v_.m_v.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    variable_set::~variable_set(&local_d8);
    return;
  }
LAB_0013aba5:
  __assert_fail("found",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/cte.cpp",
                0x30d,"void merlin::cte::joint_marginal(const variable_set &, std::vector<int> &)");
}

Assistant:

void cte::joint_marginal(const variable_set& scope, std::vector<int>& evidence) {

	// Get the cluster that contains the scope
	bool found = false;
	size_t j = 0;
	for (size_t i = 0; i < m_clusters.size(); ++i) {
		detail::node& cl = m_clusters[i];
		variable_set temp = (cl.clique & scope);
		if (temp == scope) {
			found = true;
			j = i;
			break;
		}
	}

	// Safety check
	assert(found);

	// Compute the joint marginal (belief) subject to evidence
	m_marginal = factor(scope, 0.0);
	detail::node& n = m_clusters[j];
	n.belief = n.theta.condition(evidence);
	for (std::vector<detail::edge*>::iterator ei = n.edges.begin();
			ei != n.edges.end(); ++ei) {
		detail::edge* e = (*ei);
		if (e->second->id == n.id) {
			n.belief *= e->fwd;
		}
		if (e->first->id == n.id) {
			n.belief *= e->bwd;
		}
	}

	// Update the belief entries subject to evidence
	variable_set v_rem;
	for (variable_set::const_iterator vi = n.clique.begin();
			vi != n.clique.end(); ++vi) {
		if (!scope.contains(*vi) && evidence[vi->label()] < 0) {
			v_rem |= *vi;
		}
	}
	n.belief = n.belief.sum(v_rem);

	if (m_debug) {
		std::cout << "[DEBUG] Joint marginal scope: " << m_marginal.vars() << std::endl;
		std::cout << "[DEBUG] Actual belief scope:  " << n.belief << std::endl;
	}

	// Fill in all configurations of the marginal (including the evidence)
	index_config cv1(m_marginal.vars(), true);
	config_index cv2(n.belief.vars(), true);
	for (size_t i = 0; i < m_marginal.num_states(); ++i) {
		std::map<size_t, size_t> config = cv1.convert(i);
		if (is_compatible(config, evidence)) {
			size_t j = cv2.convert(config);
			double v = n.belief.get(j);
			m_marginal.set(i, v);
		} else {
			m_marginal.set(i, 0.0);
		}
	}

	// Normalize by P(evidence)
	m_marginal /= std::exp(m_logz);

	if (m_debug) {
		std::cout << "[DEBUG] Joint marginal: " << m_marginal << std::endl;
	}
}